

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QControlledGate2<float>::apply
          (QControlledGate2<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,
          int offset)

{
  float fVar1;
  float fVar2;
  int iVar3;
  QControlledGate2<float> *pQVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  long lVar8;
  float *pfVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  char *__assertion;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  vector<int,_std::allocator<int>_> qubits;
  long local_a8;
  long local_a0;
  long local_80;
  float *local_78;
  QControlledGate2<float> *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int *local_48 [2];
  long local_38;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[5])(local_48,this);
  iVar5 = *local_48[0];
  *local_48[0] = iVar5 + offset;
  iVar6 = local_48[0][1];
  local_48[0][1] = offset + iVar6;
  if (iVar5 + offset < nbQubits) {
    if (offset + iVar6 < nbQubits) {
      local_70 = this;
      iVar5 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0x10])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))(&local_80);
      pQVar4 = local_70;
      if ((op != NoTrans) && (1 < local_80)) {
        pfVar13 = local_78 + local_80;
        pfVar9 = local_78;
        lVar8 = 0;
        do {
          lVar19 = 1;
          pfVar12 = pfVar13;
          do {
            fVar1 = pfVar9[lVar19];
            pfVar9[lVar19] = *pfVar12;
            *pfVar12 = fVar1;
            lVar17 = lVar8 + lVar19;
            lVar19 = lVar19 + 1;
            pfVar12 = pfVar12 + local_80;
          } while (lVar17 + 1 < local_80);
          pfVar13 = pfVar13 + local_80 + 1;
          pfVar9 = pfVar9 + local_80 + 1;
          bVar22 = lVar8 != local_80 + -2;
          lVar8 = lVar8 + 1;
        } while (bVar22);
      }
      iVar5 = local_70->control_;
      iVar6 = (*(local_70->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])(local_70);
      if (iVar5 < iVar6) {
        iVar5 = (*(pQVar4->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])(pQVar4);
        iVar11 = 1 << ((char)iVar5 - (char)pQVar4->control_ & 0x1fU);
        iVar5 = (*(pQVar4->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])(pQVar4);
        uVar7 = (*(pQVar4->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])(pQVar4);
        lVar8 = (long)iVar11;
        iVar6 = ~uVar7 + nbQubits;
        lVar19 = (long)(1 << ((byte)iVar5 & 0x1f));
        lVar17 = (long)(1 << ((byte)iVar6 & 0x1f));
        local_60 = matrix->size_;
        if (side == Left) {
          if (0 < local_60) {
            iVar3 = local_70->controlState_;
            lVar18 = 1;
            if (1 < lVar17) {
              lVar18 = lVar17;
            }
            lVar21 = 1;
            if (1 < lVar19) {
              lVar21 = lVar19;
            }
            lVar20 = 0;
            lVar19 = 0;
            do {
              if (iVar5 != 0x1f) {
                pfVar13 = (matrix->data_)._M_t.
                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl;
                lVar16 = lVar17 * local_60 * 4 + lVar20;
                lVar14 = 0;
                do {
                  if (iVar3 == 1) {
                    if ((long)(iVar11 / 2) <= lVar14 % lVar8) goto LAB_0010dd26;
                  }
                  else if ((iVar3 != 0) || (lVar14 % lVar8 < (long)(iVar11 / 2))) {
LAB_0010dd26:
                    pfVar9 = pfVar13;
                    lVar10 = lVar18;
                    if (iVar6 != 0x1f) {
                      do {
                        fVar1 = *(float *)((long)pfVar9 + lVar20);
                        fVar2 = *(float *)((long)pfVar9 + lVar16);
                        *(float *)((long)pfVar9 + lVar20) = *local_78 * fVar1 + local_78[1] * fVar2;
                        *(float *)((long)pfVar9 + lVar16) =
                             fVar1 * local_78[local_80] + fVar2 * local_78[local_80 + 1];
                        lVar10 = lVar10 + -1;
                        pfVar9 = pfVar9 + local_60;
                      } while (lVar10 != 0);
                    }
                  }
                  lVar14 = lVar14 + 1;
                  pfVar13 = pfVar13 + lVar17 * local_60 * 2;
                } while (lVar14 != lVar21);
              }
              lVar19 = lVar19 + 1;
              lVar20 = lVar20 + 4;
            } while (lVar19 != local_60);
          }
        }
        else if (0 < local_60) {
          iVar3 = local_70->controlState_;
          lVar18 = 1;
          if (1 < lVar17) {
            lVar18 = lVar17;
          }
          lVar21 = 1;
          if (1 < lVar19) {
            lVar21 = lVar19;
          }
          local_a8 = lVar17 * 4;
          local_a0 = 0;
          lVar19 = 0;
          do {
            if (iVar5 != 0x1f) {
              pfVar13 = (matrix->data_)._M_t.
                        super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                        super__Head_base<0UL,_float_*,_false>._M_head_impl;
              lVar20 = local_a8 + (long)pfVar13;
              lVar14 = (long)pfVar13 + local_a0;
              lVar16 = 0;
              do {
                if (iVar3 == 1) {
                  if ((long)(iVar11 / 2) <= lVar16 % lVar8) goto LAB_0010e14b;
                }
                else if ((iVar3 != 0) || (lVar16 % lVar8 < (long)(iVar11 / 2))) {
LAB_0010e14b:
                  if (iVar6 != 0x1f) {
                    lVar10 = 0;
                    do {
                      fVar1 = *(float *)(lVar14 + lVar10 * 4);
                      fVar2 = *(float *)(lVar20 + lVar10 * 4);
                      *(float *)(lVar14 + lVar10 * 4) =
                           *local_78 * fVar1 + local_78[local_80] * fVar2;
                      *(float *)(lVar20 + lVar10 * 4) =
                           fVar1 * local_78[1] + fVar2 * local_78[local_80 + 1];
                      lVar10 = lVar10 + 1;
                    } while (lVar18 != lVar10);
                  }
                }
                lVar16 = lVar16 + 1;
                lVar20 = lVar20 + lVar17 * 8;
                lVar14 = lVar14 + lVar17 * 8;
              } while (lVar16 != lVar21);
            }
            lVar19 = lVar19 + 1;
            local_a8 = local_a8 + local_60 * 4;
            local_a0 = local_a0 + local_60 * 4;
          } while (lVar19 != local_60);
        }
      }
      else {
        iVar6 = 1 << ((byte)nbQubits - (char)pQVar4->control_ & 0x1f);
        iVar5 = (*(pQVar4->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])(pQVar4);
        uVar7 = (*(pQVar4->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])(pQVar4);
        local_60 = CONCAT44(local_60._4_4_,iVar5);
        lVar17 = (long)iVar6;
        iVar11 = ~uVar7 + nbQubits;
        lVar19 = (long)(1 << ((byte)iVar5 & 0x1f));
        lVar18 = (long)(1 << ((byte)iVar11 & 0x1f));
        lVar8 = matrix->size_;
        if (side == Left) {
          if (0 < lVar8) {
            lVar21 = 1;
            if (1 < lVar18) {
              lVar21 = lVar18;
            }
            lVar20 = 1;
            if (1 < lVar19) {
              lVar20 = lVar19;
            }
            local_68 = 0;
            lVar19 = 0;
            do {
              local_58 = lVar19;
              if (iVar5 != 0x1f) {
                iVar3 = local_70->controlState_;
                lVar16 = 0;
                lVar19 = local_68;
                do {
                  if (iVar11 != 0x1f) {
                    pfVar13 = (matrix->data_)._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl;
                    lVar14 = lVar18 * lVar8 * 4 + lVar19;
                    lVar10 = 0;
                    do {
                      if (iVar3 == 1) {
                        if ((long)(iVar6 / 2) <= lVar10 % lVar17) goto LAB_0010deea;
                      }
                      else if ((iVar3 != 0) || (lVar10 % lVar17 < (long)(iVar6 / 2))) {
LAB_0010deea:
                        fVar1 = *(float *)((long)pfVar13 + lVar19);
                        fVar2 = *(float *)((long)pfVar13 + lVar14);
                        *(float *)((long)pfVar13 + lVar19) = *local_78 * fVar1 + local_78[1] * fVar2
                        ;
                        *(float *)((long)pfVar13 + lVar14) =
                             fVar1 * local_78[local_80] + fVar2 * local_78[local_80 + 1];
                      }
                      lVar10 = lVar10 + 1;
                      pfVar13 = pfVar13 + lVar8;
                    } while (lVar21 != lVar10);
                  }
                  lVar16 = lVar16 + 1;
                  lVar19 = lVar19 + lVar18 * lVar8 * 8;
                } while (lVar16 != lVar20);
              }
              local_68 = local_68 + 4;
              lVar19 = local_58 + 1;
            } while (local_58 + 1 != lVar8);
          }
        }
        else if (0 < lVar8) {
          lVar21 = 1;
          if (1 < lVar18) {
            lVar21 = lVar18;
          }
          lVar20 = 1;
          if (1 < lVar19) {
            lVar20 = lVar19;
          }
          local_58 = lVar18 * 4;
          local_50 = lVar8 * 4;
          local_68 = 0;
          lVar19 = 0;
          do {
            if (iVar5 != 0x1f) {
              iVar3 = local_70->controlState_;
              lVar10 = 0;
              lVar16 = local_58;
              lVar14 = local_68;
              do {
                if (iVar11 != 0x1f) {
                  pfVar13 = (matrix->data_)._M_t.
                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                            super__Head_base<0UL,_float_*,_false>._M_head_impl;
                  lVar15 = 0;
                  do {
                    if (iVar3 == 1) {
                      if ((long)(iVar6 / 2) <= lVar15 % lVar17) goto LAB_0010e03b;
                    }
                    else if ((iVar3 != 0) || (lVar15 % lVar17 < (long)(iVar6 / 2))) {
LAB_0010e03b:
                      fVar1 = *(float *)((long)pfVar13 + lVar15 * 4 + lVar14);
                      fVar2 = *(float *)((long)pfVar13 + lVar15 * 4 + lVar16);
                      *(float *)((long)pfVar13 + lVar15 * 4 + lVar14) =
                           *local_78 * fVar1 + local_78[local_80] * fVar2;
                      *(float *)((long)pfVar13 + lVar15 * 4 + lVar16) =
                           fVar1 * local_78[1] + fVar2 * local_78[local_80 + 1];
                    }
                    lVar15 = lVar15 + 1;
                  } while (lVar21 != lVar15);
                }
                lVar10 = lVar10 + 1;
                lVar16 = lVar16 + lVar18 * 8;
                lVar14 = lVar14 + lVar18 * 8;
              } while (lVar10 != lVar20);
            }
            lVar19 = lVar19 + 1;
            local_58 = local_58 + local_50;
            local_68 = local_68 + local_50;
          } while (lVar19 != lVar8);
        }
      }
      if (local_78 != (float *)0x0) {
        operator_delete__(local_78);
      }
      if (local_48[0] != (int *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                ,0x33,
                "virtual void qclab::qgates::QControlledGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }